

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_image_function.cpp
# Opt level: O0

pair<double,_double>
Function_Template::template_ConvertToGrayScale
          (ConvertToGrayScaleForm2 ConvertToGrayScale,string *namespaceName,uint32_t size)

{
  uint32_t uVar1;
  undefined4 in_EDX;
  code *in_RDI;
  uint32_t i;
  TimerContainer timer;
  Image output;
  Image input;
  Image *in_stack_ffffffffffffff10;
  uint32_t in_stack_ffffffffffffff18;
  uint32_t in_stack_ffffffffffffff1c;
  uint uVar2;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 uVar3;
  uint local_d4;
  BaseTimerContainer *in_stack_ffffffffffffff70;
  undefined1 local_78 [40];
  undefined1 local_50 [44];
  undefined4 local_24;
  code *local_18;
  pair<double,_double> local_10;
  
  local_24 = in_EDX;
  local_18 = in_RDI;
  Test_Helper::uniformRGBImage(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)CONCAT44(local_24,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,
             (uint8_t)((ulong)in_stack_ffffffffffffff10 >> 0x38),
             (uint8_t)((ulong)in_stack_ffffffffffffff10 >> 0x30));
  Test_Helper::uniformImage
            (in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x173032);
  SetupFunction((string *)0x17303f);
  Performance_Test::TimerContainer::TimerContainer((TimerContainer *)in_stack_ffffffffffffff10);
  local_d4 = 0;
  uVar3 = local_24;
  while( true ) {
    uVar2 = local_d4;
    uVar1 = Test_Helper::runCount();
    if (uVar1 <= uVar2) break;
    Performance_Test::TimerContainer::start((TimerContainer *)in_stack_ffffffffffffff10);
    (*local_18)(local_50,local_78);
    Performance_Test::TimerContainer::stop((TimerContainer *)CONCAT44(uVar3,uVar1));
    local_d4 = local_d4 + 1;
  }
  CleanupFunction((string *)0x173128);
  local_10 = Performance_Test::BaseTimerContainer::mean(in_stack_ffffffffffffff70);
  Performance_Test::TimerContainer::~TimerContainer((TimerContainer *)0x173168);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x173175);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x173182);
  return local_10;
}

Assistant:

std::pair < double, double > template_ConvertToGrayScale( ConvertToGrayScaleForm2 ConvertToGrayScale, const std::string & namespaceName, uint32_t size )
    {
        PenguinV_Image::Image input  = Performance_Test::uniformRGBImage( size, size );
        PenguinV_Image::Image output = Performance_Test::uniformImage   ( size, size );

        TEST_FUNCTION_LOOP( ConvertToGrayScale( input, output ), namespaceName )
    }